

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O0

void __thiscall dh::trivalitem::trivalitem(trivalitem *this)

{
  trivalitem *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,"");
  this->type = -100;
  return;
}

Assistant:

trivalitem()
	{
		this->name = "";
		this->type = -100;
	}